

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvecs.hpp
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeFrhs(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this)

{
  uint *puVar1;
  Status SVar2;
  pointer pnVar3;
  undefined8 uVar4;
  Item *pIVar5;
  int iVar6;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *v;
  pointer pnVar7;
  cpp_dec_float<50U,_int,_void> *pcVar8;
  undefined8 *puVar9;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar10;
  ulong uVar11;
  cpp_dec_float<50U,_int,_void> *v_00;
  long lVar12;
  long lVar13;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_a8;
  cpp_dec_float<50U,_int,_void> local_68;
  
  if (this->theRep == COLUMN) {
    pnVar3 = (this->theFrhs->val).
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pnVar7 = (this->theFrhs->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pnVar7 != pnVar3; pnVar7 = pnVar7 + 1)
    {
      (pnVar7->m_backend).fpclass = cpp_dec_float_finite;
      (pnVar7->m_backend).prec_elem = 10;
      (pnVar7->m_backend).data._M_elems[0] = 0;
      (pnVar7->m_backend).data._M_elems[1] = 0;
      (pnVar7->m_backend).data._M_elems[2] = 0;
      (pnVar7->m_backend).data._M_elems[3] = 0;
      (pnVar7->m_backend).data._M_elems[4] = 0;
      (pnVar7->m_backend).data._M_elems[5] = 0;
      (pnVar7->m_backend).data._M_elems[6] = 0;
      (pnVar7->m_backend).data._M_elems[7] = 0;
      *(undefined8 *)((long)(pnVar7->m_backend).data._M_elems + 0x1d) = 0;
      *(undefined8 *)((long)(pnVar7->m_backend).data._M_elems + 0x25) = 0;
    }
    if (this->theType != LEAVE) {
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x7b])(this,this->theUbound,this->theLbound);
      computeFrhs2(this,this->theCoUbound,this->theCoLbound);
      return;
    }
    (*(this->
      super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x7a])(this);
    iVar6 = (this->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum;
    if (0 < iVar6) {
      lVar12 = 0;
      lVar13 = 0;
      do {
        local_68.fpclass = cpp_dec_float_finite;
        local_68.prec_elem = 10;
        local_68.data._M_elems[0] = 0;
        local_68.data._M_elems[1] = 0;
        local_68.data._M_elems[2] = 0;
        local_68.data._M_elems[3] = 0;
        local_68.data._M_elems[4] = 0;
        local_68.data._M_elems[5] = 0;
        local_68.data._M_elems._24_5_ = 0;
        local_68.data._M_elems[7]._1_3_ = 0;
        local_68.data._M_elems._32_5_ = 0;
        local_68.data._M_elems[9]._1_3_ = 0;
        local_68.exp = 0;
        local_68.neg = false;
        SVar2 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data[lVar13];
        if (this->theRep * SVar2 < 1) {
          pVVar10 = &(this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .right;
          switch(SVar2) {
          default:
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"ESVECS01 ERROR: ",0x10);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"inconsistent basis must not happen!",0x23);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
            puVar9 = (undefined8 *)__cxa_allocate_exception(0x28);
            local_a8.data._M_elems._0_8_ = local_a8.data._M_elems + 4;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_a8,"XSVECS01 This should never happen.","");
            *puVar9 = &PTR__SPxException_003adbd8;
            puVar9[1] = puVar9 + 3;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(puVar9 + 1),local_a8.data._M_elems._0_8_,
                       local_a8.data._M_elems._0_8_ + local_a8.data._M_elems._8_8_);
            *puVar9 = &PTR__SPxException_003ae9a0;
            __cxa_throw(puVar9,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
          case P_ON_LOWER:
            pVVar10 = &(this->
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).
                       super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .left;
          case P_FIXED:
          case P_ON_UPPER:
            pnVar7 = (pVVar10->val).
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar4 = *(undefined8 *)((long)(pnVar7->m_backend).data._M_elems + lVar12 + 0x20);
            local_68.data._M_elems._32_5_ = SUB85(uVar4,0);
            local_68.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            puVar1 = (uint *)((long)(pnVar7->m_backend).data._M_elems + lVar12);
            local_68.data._M_elems._0_8_ = *(undefined8 *)puVar1;
            local_68.data._M_elems._8_8_ = *(undefined8 *)(puVar1 + 2);
            puVar1 = (uint *)((long)(pnVar7->m_backend).data._M_elems + lVar12 + 0x10);
            local_68.data._M_elems._16_8_ = *(undefined8 *)puVar1;
            uVar4 = *(undefined8 *)(puVar1 + 2);
            local_68.data._M_elems._24_5_ = SUB85(uVar4,0);
            local_68.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_68.exp = *(int *)((long)(&(pnVar7->m_backend).data + 1) + lVar12);
            local_68.neg = *(bool *)((long)(&(pnVar7->m_backend).data + 1) + lVar12 + 4U);
            local_68._48_8_ = *(undefined8 *)((long)(&(pnVar7->m_backend).data + 1) + lVar12 + 8U);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      ((cpp_dec_float<50U,_int,_void> *)
                       ((long)(((this->theFrhs->val).
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems
                       + lVar12),&local_68);
            iVar6 = (this->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.thenum;
            break;
          case P_FREE:
            break;
          }
        }
        lVar13 = lVar13 + 1;
        lVar12 = lVar12 + 0x38;
      } while (lVar13 < iVar6);
    }
  }
  else {
    if (this->theType == ENTER) {
      pnVar3 = (this->theFrhs->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pnVar7 = (this->theFrhs->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pnVar7 != pnVar3; pnVar7 = pnVar7 + 1
          ) {
        (pnVar7->m_backend).fpclass = cpp_dec_float_finite;
        (pnVar7->m_backend).prec_elem = 10;
        (pnVar7->m_backend).data._M_elems[0] = 0;
        (pnVar7->m_backend).data._M_elems[1] = 0;
        (pnVar7->m_backend).data._M_elems[2] = 0;
        (pnVar7->m_backend).data._M_elems[3] = 0;
        (pnVar7->m_backend).data._M_elems[4] = 0;
        (pnVar7->m_backend).data._M_elems[5] = 0;
        (pnVar7->m_backend).data._M_elems[6] = 0;
        (pnVar7->m_backend).data._M_elems[7] = 0;
        *(undefined8 *)((long)(pnVar7->m_backend).data._M_elems + 0x1d) = 0;
        *(undefined8 *)((long)(pnVar7->m_backend).data._M_elems + 0x25) = 0;
      }
      (*(this->
        super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x7b])(this,this->theUbound,this->theLbound);
      computeFrhs2(this,this->theCoUbound,this->theCoLbound);
      VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
      ::operator+=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                    *)this->theFrhs,
                   &(this->
                    super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .object);
      return;
    }
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::operator=(this->theFrhs,
                &(this->
                 super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .object);
    iVar6 = (this->
            super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum;
    if (0 < iVar6) {
      lVar12 = 0;
      do {
        SVar2 = (this->
                super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thedesc.rowstat.data[lVar12];
        if (this->theRep * SVar2 < 1) {
          local_a8.fpclass = cpp_dec_float_finite;
          local_a8.prec_elem = 10;
          local_a8.data._M_elems[0] = 0;
          local_a8.data._M_elems[1] = 0;
          local_a8.data._M_elems[2] = 0;
          local_a8.data._M_elems[3] = 0;
          local_a8.data._M_elems[4] = 0;
          local_a8.data._M_elems[5] = 0;
          local_a8.data._M_elems._24_5_ = 0;
          local_a8.data._M_elems[7]._1_3_ = 0;
          local_a8.data._M_elems._32_5_ = 0;
          local_a8.data._M_elems[9]._1_3_ = 0;
          local_a8.exp = 0;
          local_a8.neg = false;
          switch(SVar2) {
          case D_FREE:
            goto switchD_0028b7eb_caseD_1;
          case D_ON_UPPER:
          case D_ON_LOWER:
          case D_ON_BOTH:
            pnVar7 = (this->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .object.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar4 = *(undefined8 *)(pnVar7[lVar12].m_backend.data._M_elems + 8);
            local_a8.data._M_elems._32_5_ = SUB85(uVar4,0);
            local_a8.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_a8.data._M_elems._0_8_ = *(undefined8 *)&pnVar7[lVar12].m_backend.data;
            local_a8.data._M_elems._8_8_ =
                 *(undefined8 *)(pnVar7[lVar12].m_backend.data._M_elems + 2);
            puVar1 = pnVar7[lVar12].m_backend.data._M_elems + 4;
            local_a8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
            uVar4 = *(undefined8 *)(puVar1 + 2);
            local_a8.data._M_elems._24_5_ = SUB85(uVar4,0);
            local_a8.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
            local_a8.exp = pnVar7[lVar12].m_backend.exp;
            local_a8.neg = pnVar7[lVar12].m_backend.neg;
            uVar11._0_4_ = pnVar7[lVar12].m_backend.fpclass;
            uVar11._4_4_ = pnVar7[lVar12].m_backend.prec_elem;
            local_a8._48_8_ = uVar11;
            break;
          default:
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_a8,0.0);
            uVar11 = local_a8._48_8_ & 0xffffffff;
          }
          if ((int)uVar11 == 2) {
LAB_0028b88b:
            pIVar5 = (this->thevectors->set).theitem;
            iVar6 = (this->thevectors->set).thekey[lVar12].idx;
            lVar13 = (long)pIVar5[iVar6].data.
                           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .memused;
            if (0 < lVar13) {
              pVVar10 = this->theFrhs;
              pIVar5 = pIVar5 + iVar6;
              uVar11 = lVar13 + 1;
              lVar13 = lVar13 * 0x3c;
              do {
                pcVar8 = (cpp_dec_float<50U,_int,_void> *)
                         ((long)(pIVar5->data).
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .m_elem[-1].val.m_backend.data._M_elems + lVar13);
                local_68.fpclass = cpp_dec_float_finite;
                local_68.prec_elem = 10;
                local_68.data._M_elems[0] = 0;
                local_68.data._M_elems[1] = 0;
                local_68.data._M_elems[2] = 0;
                local_68.data._M_elems[3] = 0;
                local_68.data._M_elems[4] = 0;
                local_68.data._M_elems[5] = 0;
                local_68.data._M_elems._24_5_ = 0;
                local_68.data._M_elems[7]._1_3_ = 0;
                local_68.data._M_elems._32_5_ = 0;
                local_68.data._M_elems[9]._1_3_ = 0;
                local_68.exp = 0;
                local_68.neg = false;
                v_00 = &local_a8;
                if (pcVar8 != &local_68) {
                  local_68.data._M_elems._32_5_ = local_a8.data._M_elems._32_5_;
                  local_68.data._M_elems[9]._1_3_ = local_a8.data._M_elems[9]._1_3_;
                  local_68.data._M_elems[4] = local_a8.data._M_elems[4];
                  local_68.data._M_elems[5] = local_a8.data._M_elems[5];
                  local_68.data._M_elems._24_5_ = local_a8.data._M_elems._24_5_;
                  local_68.data._M_elems[7]._1_3_ = local_a8.data._M_elems[7]._1_3_;
                  local_68.data._M_elems[0] = local_a8.data._M_elems[0];
                  local_68.data._M_elems[1] = local_a8.data._M_elems[1];
                  local_68.data._M_elems[2] = local_a8.data._M_elems[2];
                  local_68.data._M_elems[3] = local_a8.data._M_elems[3];
                  local_68.exp = local_a8.exp;
                  local_68.neg = local_a8.neg;
                  local_68.fpclass = local_a8.fpclass;
                  local_68.prec_elem = local_a8.prec_elem;
                  v_00 = pcVar8;
                }
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                          (&local_68,v_00);
                boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                          (&(pVVar10->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start
                            [*(int *)((long)(&(pIVar5->data).
                                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                              .m_elem[-1].val + 1) + lVar13)].m_backend,&local_68);
                uVar11 = uVar11 - 1;
                lVar13 = lVar13 + -0x3c;
              } while (1 < uVar11);
            }
          }
          else {
            local_68.fpclass = cpp_dec_float_finite;
            local_68.prec_elem = 10;
            local_68.data._M_elems[0] = 0;
            local_68.data._M_elems[1] = 0;
            local_68.data._M_elems[2] = 0;
            local_68.data._M_elems[3] = 0;
            local_68.data._M_elems[4] = 0;
            local_68.data._M_elems[5] = 0;
            local_68.data._M_elems._24_5_ = 0;
            local_68.data._M_elems[7]._1_3_ = 0;
            local_68.data._M_elems._32_5_ = 0;
            local_68.data._M_elems[9]._1_3_ = 0;
            local_68.exp = 0;
            local_68.neg = false;
            boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                      ((cpp_dec_float<50u,int,void> *)&local_68,0.0);
            iVar6 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                              (&local_a8,&local_68);
            if (iVar6 != 0) goto LAB_0028b88b;
          }
          iVar6 = (this->
                  super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).
                  super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .
                  super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  .set.thenum;
        }
switchD_0028b7eb_caseD_1:
        lVar12 = lVar12 + 1;
      } while (lVar12 < iVar6);
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeFrhs()
{

   if(rep() == COLUMN)
   {
      theFrhs->clear();

      if(type() == LEAVE)
      {
         computeFrhsXtra();

         for(int i = 0; i < this->nRows(); i++)
         {
            R x;

            typename SPxBasisBase<R>::Desc::Status stat = this->desc().rowStatus(i);

            if(!isBasic(stat))
            {
               // coverity[switch_selector_expr_is_constant]
               switch(stat)
               {
               // columnwise cases:
               case SPxBasisBase<R>::Desc::P_FREE :
                  continue;

               case(SPxBasisBase<R>::Desc::P_FIXED) :
                  assert(EQ(this->lhs(i), this->rhs(i), this->epsilon()));

               //lint -fallthrough
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  x = this->rhs(i);
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  x = this->lhs(i);
                  break;

               default:
                  SPX_MSG_ERROR(std::cerr << "ESVECS01 ERROR: "
                                << "inconsistent basis must not happen!"
                                << std::endl;)
                  throw SPxInternalCodeException("XSVECS01 This should never happen.");
               }

               assert(x < R(infinity));
               assert(x > R(-infinity));
               (*theFrhs)[i] += x;     // slack !
            }
         }
      }
      else
      {
         computeFrhs1(*theUbound, *theLbound);
         computeFrhs2(*theCoUbound, *theCoLbound);
      }
   }
   else
   {
      assert(rep() == ROW);

      if(type() == ENTER)
      {
         theFrhs->clear();
         computeFrhs1(*theUbound, *theLbound);
         computeFrhs2(*theCoUbound, *theCoLbound);
         *theFrhs += this->maxObj();
      }
      else
      {
         ///@todo put this into a separate method
         *theFrhs = this->maxObj();
         const typename SPxBasisBase<R>::Desc& ds = this->desc();

         for(int i = 0; i < this->nRows(); ++i)
         {
            typename SPxBasisBase<R>::Desc::Status stat = ds.rowStatus(i);

            if(!isBasic(stat))
            {
               R x;

               // coverity[switch_selector_expr_is_constant]
               switch(stat)
               {
               case SPxBasisBase<R>::Desc::D_FREE :
                  continue;

               case SPxBasisBase<R>::Desc::D_ON_UPPER :
               case SPxBasisBase<R>::Desc::D_ON_LOWER :
               case(SPxBasisBase<R>::Desc::D_ON_BOTH) :
                  x = this->maxRowObj(i);
                  break;

               default:
                  assert(this->lhs(i) <= R(-infinity) && this->rhs(i) >= R(infinity));
                  x = 0.0;
                  break;
               }

               assert(x < R(infinity));
               assert(x > R(-infinity));
               // assert(x == 0.0);

               if(x != 0.0)
                  theFrhs->multAdd(x, vector(i));
            }
         }
      }
   }
}